

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseExpression.cpp
# Opt level: O3

Expression * __thiscall
Kandinsky::BaseExpression::differentiate
          (Expression *__return_storage_ptr__,BaseExpression *this,Variable *variable)

{
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  element_type *local_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  local_28 = (variable->m_variableExpressionPtr).
             super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_20 = (variable->m_variableExpressionPtr).
             super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_20->_M_use_count = local_20->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_20->_M_use_count = local_20->_M_use_count + 1;
    }
  }
  (*this->_vptr_BaseExpression[1])(&local_18,this,&local_28);
  __return_storage_ptr__->_vptr_Expression = (_func_int **)&PTR_variables_00110c58;
  (__return_storage_ptr__->m_baseExpressionPtr).
  super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_18;
  (__return_storage_ptr__->m_baseExpressionPtr).
  super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_10;
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_10->_M_use_count = local_10->_M_use_count + 1;
      UNLOCK();
      if (local_10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0010a984;
    }
    else {
      local_10->_M_use_count = local_10->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
LAB_0010a984:
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

Expression BaseExpression::differentiate(const Variable& variable) const
    {
        return Expression(derivative(variable.getVariableExpressionPtr()));
    }